

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::cpp_unittest::GeneratedMessageTest_TestFileVsMessageScope_Test::
TestBody(GeneratedMessageTest_TestFileVsMessageScope_Test *this)

{
  undefined1 auStack_38 [48];
  
  proto2_unittest::TestConflictingSymbolNames_BadKnownNamesValues::
  TestConflictingSymbolNames_BadKnownNamesValues
            ((TestConflictingSymbolNames_BadKnownNamesValues *)auStack_38,(Arena *)0x0);
  protobuf::internal::ExtensionSet::GetInt32
            ((ExtensionSet *)(auStack_38 + 0x10),
             proto2_unittest::TestConflictingSymbolNames_BadKnownNamesValues::unknown_fields_,
             DAT_0197daf4);
  proto2_unittest::TestConflictingSymbolNames_BadKnownNamesValues::
  ~TestConflictingSymbolNames_BadKnownNamesValues
            ((TestConflictingSymbolNames_BadKnownNamesValues *)auStack_38);
  proto2_unittest::TestConflictingSymbolNames_BadKnownNamesValues::
  TestConflictingSymbolNames_BadKnownNamesValues
            ((TestConflictingSymbolNames_BadKnownNamesValues *)auStack_38,(Arena *)0x0);
  protobuf::internal::ExtensionSet::GetInt32
            ((ExtensionSet *)(auStack_38 + 0x10),proto2_unittest::unknown_fields,DAT_0197db24);
  proto2_unittest::TestConflictingSymbolNames_BadKnownNamesValues::
  ~TestConflictingSymbolNames_BadKnownNamesValues
            ((TestConflictingSymbolNames_BadKnownNamesValues *)auStack_38);
  return;
}

Assistant:

TEST(GENERATED_MESSAGE_TEST_NAME, TestFileVsMessageScope) {
  // Special names at message scope are mangled,
  int v [[maybe_unused]] =
      proto2_unittest::TestConflictingSymbolNames::BadKnownNamesValues()
          .GetExtension(proto2_unittest::TestConflictingSymbolNames::
                            BadKnownNamesValues::unknown_fields_);
  // But not at file scope.
  v = proto2_unittest::TestConflictingSymbolNames::BadKnownNamesValues()
          .GetExtension(proto2_unittest::unknown_fields);
}